

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::CLUFactor<double>::vSolveRight4update
          (CLUFactor<double> *this,double eps,double *vec,int *idx,double *rhs,int *ridx,int rn,
          double *forest,int *forestNum,int *forestIdx)

{
  double dVar1;
  int *piVar2;
  CLUFactor<double> *this_00;
  double *vec_00;
  long lVar3;
  int iVar4;
  long lVar5;
  double dVar6;
  int local_74;
  double local_70;
  int local_68;
  int local_64;
  CLUFactor<double> *local_60;
  double *local_58;
  int *local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_74 = rn;
  local_70 = eps;
  local_58 = vec;
  local_50 = idx;
  vSolveLright(this,rhs,ridx,&local_74,eps);
  dVar6 = local_70;
  local_60 = this;
  if (forest == (double *)0x0) {
    piVar2 = (this->row).perm;
    local_64 = 0;
    lVar3 = (long)local_74;
    for (lVar5 = 0; iVar4 = local_64, lVar5 < lVar3; lVar5 = lVar5 + 1) {
      iVar4 = ridx[lVar5];
      if (ABS(rhs[iVar4]) <= dVar6) {
        rhs[iVar4] = 0.0;
      }
      else {
        enQueueMax(ridx,&local_64,piVar2[iVar4]);
        dVar6 = local_70;
      }
    }
  }
  else {
    piVar2 = (this->row).perm;
    local_68 = 0;
    for (lVar3 = 0; lVar3 < local_74; lVar3 = lVar3 + 1) {
      iVar4 = ridx[lVar3];
      dVar1 = rhs[iVar4];
      if (ABS(dVar1) <= dVar6) {
        rhs[iVar4] = 0.0;
      }
      else {
        *forestIdx = iVar4;
        forestIdx = forestIdx + 1;
        uStack_40 = 0;
        local_48 = dVar1;
        enQueueMax(ridx,&local_68,piVar2[iVar4]);
        forest[iVar4] = local_48;
        dVar6 = local_70;
      }
    }
    *forestNum = local_68;
    iVar4 = local_68;
  }
  piVar2 = local_50;
  vec_00 = local_58;
  this_00 = local_60;
  local_74 = iVar4;
  local_74 = vSolveUright(local_60,local_58,local_50,rhs,ridx,iVar4,dVar6);
  if ((this_00->l).updateType == 0) {
    local_74 = vSolveUpdateRight(this_00,vec_00,piVar2,local_74,local_70);
  }
  return local_74;
}

Assistant:

int CLUFactor<R>::vSolveRight4update(R eps,
                                     R* vec, int* idx,                       /* result */
                                     R* rhs, int* ridx, int rn,              /* rhs    */
                                     R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright(rhs, ridx, rn, eps);
   assert(rn >= 0 && rn <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
      rn = vSolveUpdateRight(vec, idx, rn, eps);

   return rn;
}